

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureSRGB(GatherBase *this)

{
  int internalformat;
  GLenum format_00;
  reference pixels_00;
  undefined8 uStack_78;
  GLubyte data [16];
  allocator<unsigned_char> local_4a;
  value_type_conflict5 local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  int i;
  GLenum tex_type;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  GatherBase *this_local;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  format_00 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])();
  tex_type = 0x20;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             this->tex);
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < (int)tex_type; tex_type = (int)tex_type / 2) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,internalformat,tex_type,tex_type,0,
               format_00,0x1401,(void *)0x0);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  local_49 = 0xff;
  std::allocator<unsigned_char>::allocator(&local_4a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x1000,&local_49,
             &local_4a);
  std::allocator<unsigned_char>::~allocator(&local_4a);
  pixels_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,0,
             0,0x20,0x20,format_00,0x1401,pixels_00);
  if (format_00 != 0x1902) {
    glu::CallLogWrapper::glGenerateMipmap
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1);
  }
  uStack_78 = 0xb0a09a00f0e0df0;
  data[0] = '\0';
  data[1] = '\x01';
  data[2] = '\x02';
  data[3] = '\x03';
  data[4] = 'P';
  data[5] = '\x05';
  data[6] = '\x06';
  data[7] = '\a';
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,
             0x16,0x19,2,2,format_00,0x1401,&uStack_78);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,
             0x10,10,1,1,format_00,0x1401,&uStack_78);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,
             0xb,2,1,1,format_00,0x1401,(void *)((long)&uStack_78 + 4));
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,
             0x18,0xd,1,1,format_00,0x1401,data);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,9,
             0xe,1,1,format_00,0x1401,data + 4);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x8072,0x812f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

virtual GLvoid CreateTextureSRGB()
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_UNSIGNED_BYTE;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
		}
		std::vector<GLubyte> pixels(csize * csize * 4, 255);
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, tex_type, &pixels[0]);

		if (format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(target);
		}

		GLubyte data[16] = { 240, 13, 14, 15, 160, 9, 10, 11, 0, 1, 2, 3, 80, 5, 6, 7 };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, format, tex_type, data + 4);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, format, tex_type, data + 8);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, format, tex_type, data + 12);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}